

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache.c
# Opt level: O0

int vmemcache_set_size(VMEMcache *cache,size_t size)

{
  int *piVar1;
  size_t size_local;
  VMEMcache *cache_local;
  
  if ((cache->field_0x58 & 1) == 0) {
    if (size < 0x100000) {
      out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
              0x59,"vmemcache_set_size","size %zu smaller than %zu",size,0x100000);
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      cache_local._4_4_ = -1;
    }
    else if (size < 0x100000000000000) {
      cache->size = size;
      cache_local._4_4_ = 0;
    }
    else {
      out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
              0x5f,"vmemcache_set_size","implausible large size %zu",size);
      piVar1 = __errno_location();
      *piVar1 = 0x16;
      cache_local._4_4_ = -1;
    }
  }
  else {
    out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache.c",
            0x53,"vmemcache_set_size","cache already in use");
    piVar1 = __errno_location();
    *piVar1 = 0x72;
    cache_local._4_4_ = -1;
  }
  return cache_local._4_4_;
}

Assistant:

int
vmemcache_set_size(VMEMcache *cache, size_t size)
{
	LOG(3, "cache %p size %zu", cache, size);

	/* TODO: allow growing this way */
	if (cache->ready) {
		ERR("cache already in use");
		errno =  EALREADY;
		return -1;
	}

	if (size < VMEMCACHE_MIN_POOL) {
		ERR("size %zu smaller than %zu", size, VMEMCACHE_MIN_POOL);
		errno = EINVAL;
		return -1;
	}

	if (size >= 1ULL << ((sizeof(void *) > 4) ? 56 : 31)) {
		ERR("implausible large size %zu", size);
		errno = EINVAL;
		return -1;
	}

	cache->size = size;
	return 0;
}